

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void suffixedexp(LexState *ls,expdesc *v)

{
  int where;
  int iVar1;
  FuncState *fs;
  TString *s;
  int line;
  expdesc key;
  expdesc local_40;
  
  fs = ls->fs;
  where = ls->linenumber;
  iVar1 = (ls->t).token;
  if (iVar1 == 0x124) {
    singlevar(ls,v);
  }
  else {
    if (iVar1 != 0x28) {
      luaX_syntaxerror(ls,"unexpected symbol");
    }
    luaX_next(ls);
    subexpr(ls,v,0);
    check_match(ls,0x29,0x28,where);
    luaK_dischargevars(ls->fs,v);
  }
LAB_0010f4f8:
  while (iVar1 = (ls->t).token, 0x5a < iVar1) {
    if (iVar1 != 0x5b) {
      if ((iVar1 != 0x7b) && (iVar1 != 0x125)) {
        return;
      }
      goto LAB_0010f569;
    }
    luaK_exp2anyregup(fs,v);
    yindex(ls,&local_40);
    luaK_indexed(fs,v,&local_40);
  }
  if (iVar1 == 0x28) {
LAB_0010f569:
    luaK_exp2nextreg(fs,v);
  }
  else {
    if (iVar1 == 0x2e) {
      fieldsel(ls,v);
      goto LAB_0010f4f8;
    }
    if (iVar1 != 0x3a) {
      return;
    }
    luaX_next(ls);
    s = str_checkname(ls);
    local_40.u.info = luaK_stringK(ls->fs,s);
    local_40.t = -1;
    local_40.f = -1;
    local_40.k = VK;
    luaK_self(fs,v,&local_40);
  }
  funcargs(ls,v,where);
  goto LAB_0010f4f8;
}

Assistant:

static void suffixedexp (LexState *ls, expdesc *v) {
  /* suffixedexp ->
       primaryexp { '.' NAME | '[' exp ']' | ':' NAME funcargs | funcargs } */
  FuncState *fs = ls->fs;
  int line = ls->linenumber;
  primaryexp(ls, v);
  for (;;) {
    switch (ls->t.token) {
      case '.': {  /* fieldsel */
        fieldsel(ls, v);
        break;
      }
      case '[': {  /* '[' exp1 ']' */
        expdesc key;
        luaK_exp2anyregup(fs, v);
        yindex(ls, &key);
        luaK_indexed(fs, v, &key);
        break;
      }
      case ':': {  /* ':' NAME funcargs */
        expdesc key;
        luaX_next(ls);
        checkname(ls, &key);
        luaK_self(fs, v, &key);
        funcargs(ls, v, line);
        break;
      }
      case '(': case TK_STRING: case '{': {  /* funcargs */
        luaK_exp2nextreg(fs, v);
        funcargs(ls, v, line);
        break;
      }
      default: return;
    }
  }
}